

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O2

void mapVoronoiZoom(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  void *__ptr;
  long chunkZ;
  long chunkZ_00;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  long chunkX;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  void *__src;
  int iVar29;
  bool bVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  int *local_48;
  int local_3c;
  
  uVar19 = (int)areaX - 2;
  uVar5 = (int)areaZ - 2;
  iVar20 = (int)uVar19 >> 2;
  iVar6 = (int)uVar5 >> 2;
  iVar22 = areaWidth >> 2;
  iVar1 = iVar22 + 2;
  uVar26 = areaWidth & 0xfffffffc;
  iVar29 = areaHeight >> 2;
  iVar2 = uVar26 + 4;
  __ptr = malloc((long)(int)(((areaHeight & 0xfffffffcU) + 5) * (uVar26 + 5)) << 2);
  (*l->p->getMap)(l->p,out,(long)iVar20,(long)iVar6,iVar1,iVar29 + 2);
  if (iVar22 < 0) {
    iVar22 = -1;
  }
  if (iVar29 < 0) {
    iVar29 = -1;
  }
  local_3c = 0;
  uVar28 = 0;
  while (uVar28 != iVar29 + 1) {
    iVar7 = (int)uVar28 + iVar6;
    chunkZ_00 = (long)(iVar7 * 4);
    chunkZ = (long)(iVar7 * 4 + 4);
    uVar18 = 0;
    uVar27 = out[uVar28 * (long)iVar1];
    uVar23 = out[(uVar28 + 1) * (long)iVar1];
    iVar7 = local_3c;
    while (uVar18 != iVar22 + 1) {
      iVar8 = iVar20 + (int)uVar18;
      lVar25 = (long)(iVar8 * 4);
      setChunkSeed(l,lVar25,chunkZ_00);
      iVar9 = mcNextInt(l,0x400);
      iVar10 = mcNextInt(l,0x400);
      chunkX = (long)(iVar8 * 4 + 4);
      setChunkSeed(l,chunkX,chunkZ_00);
      iVar11 = mcNextInt(l,0x400);
      iVar12 = mcNextInt(l,0x400);
      setChunkSeed(l,lVar25,chunkZ);
      iVar13 = mcNextInt(l,0x400);
      iVar14 = mcNextInt(l,0x400);
      setChunkSeed(l,chunkX,chunkZ);
      iVar15 = mcNextInt(l,0x400);
      iVar16 = mcNextInt(l,0x400);
      uVar3 = (out + uVar28 * (long)iVar1)[uVar18 + 1];
      uVar4 = (out + (uVar28 + 1) * (long)iVar1)[uVar18 + 1];
      iVar24 = 0;
      dVar31 = 0.0;
      iVar8 = iVar7;
      while( true ) {
        uVar17 = (uint)(byte)uVar3;
        uVar21 = (uint)(byte)uVar4;
        if (iVar24 == 4) break;
        dVar32 = dVar31 - ((double)iVar10 * 0.0009765625 + -0.5) * 3.6;
        dVar33 = dVar31 - ((double)iVar12 * 0.0009765625 + -0.5) * 3.6;
        dVar34 = dVar31 - (((double)iVar14 * 0.0009765625 + -0.5) * 3.6 + 4.0);
        dVar35 = dVar31 - (((double)iVar16 * 0.0009765625 + -0.5) * 3.6 + 4.0);
        dVar36 = 0.0;
        for (lVar25 = 0; (int)lVar25 != 4; lVar25 = lVar25 + 1) {
          dVar37 = dVar36 - ((double)iVar9 * 0.0009765625 + -0.5) * 3.6;
          dVar37 = dVar32 * dVar32 + dVar37 * dVar37;
          dVar38 = dVar36 - (((double)iVar11 * 0.0009765625 + -0.5) * 3.6 + 4.0);
          dVar38 = dVar33 * dVar33 + dVar38 * dVar38;
          dVar39 = dVar36 - ((double)iVar13 * 0.0009765625 + -0.5) * 3.6;
          dVar39 = dVar34 * dVar34 + dVar39 * dVar39;
          dVar40 = dVar36 - (((double)iVar15 * 0.0009765625 + -0.5) * 3.6 + 4.0);
          dVar40 = dVar35 * dVar35 + dVar40 * dVar40;
          if (((dVar38 <= dVar37) || (dVar39 <= dVar37)) || (dVar40 <= dVar37)) {
            if (((dVar37 <= dVar38) || (dVar39 <= dVar38)) || (dVar40 <= dVar38)) {
              if (((dVar37 <= dVar39) || (dVar38 <= dVar39)) || (dVar40 <= dVar39)) {
                *(uint *)((long)__ptr + lVar25 * 4 + (long)iVar8 * 4) = uVar21;
              }
              else {
                *(uint *)((long)__ptr + lVar25 * 4 + (long)iVar8 * 4) = uVar23;
              }
            }
            else {
              *(uint *)((long)__ptr + lVar25 * 4 + (long)iVar8 * 4) = uVar17;
            }
          }
          else {
            *(uint *)((long)__ptr + lVar25 * 4 + (long)iVar8 * 4) = uVar27;
          }
          dVar36 = dVar36 + 1.0;
        }
        dVar31 = dVar31 + 1.0;
        iVar24 = iVar24 + 1;
        iVar8 = iVar8 + iVar2;
      }
      iVar7 = iVar7 + 4;
      uVar18 = uVar18 + 1;
      uVar27 = uVar17;
      uVar23 = uVar21;
    }
    local_3c = local_3c + uVar26 * 4 + 0x10;
    uVar28 = uVar28 + 1;
  }
  uVar26 = 0;
  if (0 < areaHeight) {
    uVar26 = areaHeight;
  }
  uVar28 = (ulong)uVar26;
  __src = (void *)(((ulong)(uVar5 & 3) * (long)iVar2 + (ulong)(uVar19 & 3)) * 4 + (long)__ptr);
  local_48 = out;
  while (bVar30 = uVar28 != 0, uVar28 = uVar28 - 1, bVar30) {
    memcpy(local_48,__src,(long)areaWidth * 4);
    __src = (void *)((long)__src + (long)iVar2 * 4);
    local_48 = local_48 + areaWidth;
  }
  free(__ptr);
  return;
}

Assistant:

void mapVoronoiZoom(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    areaX -= 2;
    areaZ -= 2;
    int pX = (int) areaX >> 2;
    int pZ = (int) areaZ >> 2;
    int pWidth = (areaWidth >> 2) + 2;
    int pHeight = (areaHeight >> 2) + 2;
    int newWidth = (pWidth - 1) << 2;
    int newHeight = (pHeight - 1) << 2;
    int x, z, i, j;
    int *buf = (int *) malloc((newWidth + 1) * (newHeight + 1) * sizeof(*buf));

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    for (z = 0; z < pHeight - 1; z++) {
        int v00 = out[(z + 0) * pWidth];
        int v01 = out[(z + 1) * pWidth];

        for (x = 0; x < pWidth - 1; x++) {
            setChunkSeed(l, (x + pX) << 2, (z + pZ) << 2);
            double da1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;
            double da2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;

            setChunkSeed(l, (x + pX + 1) << 2, (z + pZ) << 2);
            double db1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;
            double db2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;

            setChunkSeed(l, (x + pX) << 2, (z + pZ + 1) << 2);
            double dc1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;
            double dc2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;

            setChunkSeed(l, (x + pX + 1) << 2, (z + pZ + 1) << 2);
            double dd1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;
            double dd2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;

            int v10 = out[x + 1 + (z + 0) * pWidth] & 255;
            int v11 = out[x + 1 + (z + 1) * pWidth] & 255;

            for (j = 0; j < 4; j++) {
                int idx = ((z << 2) + j) * newWidth + (x << 2);

                for (i = 0; i < 4; i++) {
                    double da = (j - da2) * (j - da2) + (i - da1) * (i - da1);
                    double db = (j - db2) * (j - db2) + (i - db1) * (i - db1);
                    double dc = (j - dc2) * (j - dc2) + (i - dc1) * (i - dc1);
                    double dd = (j - dd2) * (j - dd2) + (i - dd1) * (i - dd1);

                    if (da < db && da < dc && da < dd) {
                        buf[idx++] = v00;
                    } else if (db < da && db < dc && db < dd) {
                        buf[idx++] = v10;
                    } else if (dc < da && dc < db && dc < dd) {
                        buf[idx++] = v01;
                    } else {
                        buf[idx++] = v11;
                    }
                }
            }

            v00 = v10;
            v01 = v11;
        }
    }

    for (z = 0; z < areaHeight; z++) {
        memcpy(&out[z * areaWidth], &buf[(z + (areaZ & 3)) * newWidth + (areaX & 3)], areaWidth * sizeof(int));
    }

    free(buf);
}